

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerPrologEpilogAsmJs(Lowerer *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EntryInstr *entryInstr;
  ExitInstr *exitInstr;
  
  pIVar1 = this->m_func->m_headInstr;
  if (pIVar1->m_kind != InstrKindEntry) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x156d,"(instr->IsEntryInstr())","First instr isn\'t an EntryInstr...");
    if (!bVar3) goto LAB_00566a98;
    *puVar4 = 0;
  }
  entryInstr = IR::Instr::AsEntryInstr(pIVar1);
  LowererMD::LowerEntryInstr(&this->m_lowererMD,entryInstr);
  pIVar1 = this->m_func->m_exitInstr;
  if (pIVar1->m_kind != InstrKindExit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1572,"(instr->IsExitInstr())","Last instr isn\'t an ExitInstr...");
    if (!bVar3) {
LAB_00566a98:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  exitInstr = IR::Instr::AsExitInstr(pIVar1);
  LowererMD::LowerExitInstrAsmJs(&this->m_lowererMD,exitInstr);
  return;
}

Assistant:

void
Lowerer::LowerPrologEpilogAsmJs()
{
    IR::Instr * instr;

    instr = m_func->m_headInstr;
    AssertMsg(instr->IsEntryInstr(), "First instr isn't an EntryInstr...");

    m_lowererMD.LowerEntryInstr(instr->AsEntryInstr());

    instr = m_func->m_exitInstr;
    AssertMsg(instr->IsExitInstr(), "Last instr isn't an ExitInstr...");

    m_lowererMD.LowerExitInstrAsmJs(instr->AsExitInstr());
}